

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calculateCrossProducts
          (BeagleCPUImpl<double,_1,_0> *this,int *postBufferIndices,int *preBufferIndices,
          int *categoryRatesIndices,int *categoryWeightsIndices,double *edgeLengths,int count,
          double *outSumDerivatives,double *outSumSquaredDerivatives)

{
  int iVar1;
  
  iVar1 = (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x39])();
  return iVar1;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calculateCrossProducts(const int *postBufferIndices,
                                                              const int *preBufferIndices,
                                                              const int *categoryRatesIndices,
                                                              const int *categoryWeightsIndices,
                                                              const double *edgeLengths,
                                                              int count,
                                                              double *outSumDerivatives,
                                                              double *outSumSquaredDerivatives) {
    return calcCrossProducts(
            postBufferIndices, preBufferIndices,
            categoryRatesIndices,
            categoryWeightsIndices,
            edgeLengths,
            count,
            outSumDerivatives,
            outSumSquaredDerivatives);
}